

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

char * getattrib(rnndb *db,char *file,int line,xmlAttr *attr)

{
  _xmlNode *local_38;
  xmlNode *chain;
  xmlAttr *attr_local;
  int line_local;
  char *file_local;
  rnndb *db_local;
  
  local_38 = attr->children;
  while( true ) {
    if (local_38 == (_xmlNode *)0x0) {
      return "";
    }
    if (local_38->type == XML_TEXT_NODE) break;
    fprintf(_stderr,"%s:%d: unknown attribute child \"%s\" in attribute \"%s\"\n",file,
            (ulong)(uint)line,local_38->name,attr->name);
    db->estatus = 1;
    local_38 = local_38->next;
  }
  return (char *)local_38->content;
}

Assistant:

static char *getattrib (struct rnndb *db, char *file, int line, xmlAttr *attr) {
	xmlNode *chain = attr->children;
	while (chain) {
		if (chain->type != XML_TEXT_NODE) {
			fprintf (stderr, "%s:%d: unknown attribute child \"%s\" in attribute \"%s\"\n", file, line, chain->name, attr->name);
			db->estatus = 1;
		} else {
			return chain->content;
		}
		chain = chain->next;
	}
	return "";
}